

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O0

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  undefined8 *in_RSI;
  long *in_RDI;
  int m;
  int v;
  int k;
  int sign;
  int tbl;
  uchar *st;
  JBLOCKROW block;
  arith_entropy_ptr_conflict entropy;
  uint local_44;
  uint local_40;
  int local_3c;
  j_decompress_ptr in_stack_ffffffffffffffd0;
  uchar *st_00;
  j_decompress_ptr cinfo_00;
  
  cinfo_00 = (j_decompress_ptr)in_RDI[0x4a];
  if ((int)in_RDI[0x2e] != 0) {
    if (*(int *)&cinfo_00->field_0x4c == 0) {
      process_restart(in_stack_ffffffffffffffd0);
    }
    *(int *)&cinfo_00->field_0x4c = *(int *)&cinfo_00->field_0x4c + -1;
  }
  if (*(int *)&cinfo_00->src != -1) {
    st_00 = (uchar *)*in_RSI;
    local_3c = *(int *)((long)in_RDI + 0x20c);
    while ((local_3c <= (int)in_RDI[0x42] && (iVar1 = arith_decode(cinfo_00,st_00), iVar1 == 0))) {
      while (iVar1 = arith_decode(cinfo_00,st_00), iVar1 == 0) {
        local_3c = local_3c + 1;
        if ((int)in_RDI[0x42] < local_3c) {
          *(undefined4 *)(*in_RDI + 0x28) = 0x7e;
          (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
          *(undefined4 *)&cinfo_00->src = 0xffffffff;
          return 1;
        }
      }
      iVar1 = arith_decode(cinfo_00,st_00);
      local_44 = arith_decode(cinfo_00,st_00);
      if ((local_44 != 0) && (iVar2 = arith_decode(cinfo_00,st_00), iVar2 != 0)) {
        local_44 = local_44 << 1;
        while (iVar2 = arith_decode(cinfo_00,st_00), iVar2 != 0) {
          local_44 = local_44 << 1;
          if (local_44 == 0x8000) {
            *(undefined4 *)(*in_RDI + 0x28) = 0x7e;
            (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
            *(undefined4 *)&cinfo_00->src = 0xffffffff;
            return 1;
          }
        }
      }
      local_40 = local_44;
      while (local_44 = (int)local_44 >> 1, local_44 != 0) {
        iVar2 = arith_decode(cinfo_00,st_00);
        if (iVar2 != 0) {
          local_40 = local_44 | local_40;
        }
      }
      local_40 = local_40 + 1;
      if (iVar1 != 0) {
        local_40 = -local_40;
      }
      *(short *)(st_00 + (long)jpeg_natural_order[local_3c] * 2) =
           (short)(local_40 << ((byte)(int)in_RDI[0x43] & 0x1f));
      local_3c = local_3c + 1;
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  int Se = cinfo->Se;
  int Al = cinfo->Al;
  register int s, k, r;
  unsigned int EOBRUN;
  JBLOCKROW block;
  BITREAD_STATE_VARS;
  d_derived_tbl *tbl;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!process_restart(cinfo))
        return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (!entropy->pub.insufficient_data) {

    /* Load up working state.
     * We can avoid loading/saving bitread state if in an EOB run.
     */
    EOBRUN = entropy->saved.EOBRUN;     /* only part of saved state we need */

    /* There is always only one block per MCU */

    if (EOBRUN > 0)             /* if it's a band of zeroes... */
      EOBRUN--;                 /* ...process it now (we do nothing) */
    else {
      BITREAD_LOAD_STATE(cinfo, entropy->bitstate);
      block = MCU_data[0];
      tbl = entropy->ac_derived_tbl;

      for (k = cinfo->Ss; k <= Se; k++) {
        HUFF_DECODE(s, br_state, tbl, return FALSE, label2);
        r = s >> 4;
        s &= 15;
        if (s) {
          k += r;
          CHECK_BIT_BUFFER(br_state, s, return FALSE);
          r = GET_BITS(s);
          s = HUFF_EXTEND(r, s);
          /* Scale and output coefficient in natural (dezigzagged) order */
          (*block)[jpeg_natural_order[k]] = (JCOEF)LEFT_SHIFT(s, Al);
        } else {
          if (r == 15) {        /* ZRL */
            k += 15;            /* skip 15 zeroes in band */
          } else {              /* EOBr, run length is 2^r + appended bits */
            EOBRUN = 1 << r;
            if (r) {            /* EOBr, r > 0 */
              CHECK_BIT_BUFFER(br_state, r, return FALSE);
              r = GET_BITS(r);
              EOBRUN += r;
            }
            EOBRUN--;           /* this band is processed at this moment */
            break;              /* force end-of-band */
          }
        }
      }

      BITREAD_SAVE_STATE(cinfo, entropy->bitstate);
    }

    /* Completed MCU, so update state */
    entropy->saved.EOBRUN = EOBRUN;     /* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  if (cinfo->restart_interval)
    entropy->restarts_to_go--;

  return TRUE;
}